

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

void __thiscall
FileTokenizer::createToken
          (FileTokenizer *this,TokenType type,size_t length,string *value,size_t valuePos,
          size_t valueLength)

{
  size_t sVar1;
  _Alloc_hider _Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  string valueStr;
  string originalStr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  long *local_f0;
  undefined8 local_e8;
  undefined1 local_e0;
  undefined7 uStack_df;
  undefined8 uStack_d8;
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  long *local_70;
  undefined8 local_68;
  long local_60;
  undefined8 uStack_58;
  Identifier local_50;
  
  (this->token).type = type;
  sVar1 = this->linePos;
  (this->token).line = this->lineNumber;
  (this->token).column = sVar1 + 1;
  std::__cxx11::string::substr((ulong)&local_110,(ulong)value);
  std::__cxx11::string::substr((ulong)&local_f0,(ulong)&this->currentLine);
  if ((type & ~Assign) == Identifier) {
    paVar3 = &local_90.field_2;
    if (local_110 == &local_100) {
      local_90.field_2._8_8_ = local_100._8_8_;
      local_90._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_90._M_dataplus._M_p = (pointer)local_110;
    }
    local_90._M_string_length = local_108;
    local_108 = 0;
    local_100._M_local_buf[0] = '\0';
    local_110 = &local_100;
    Identifier::Identifier(&local_50,&local_90);
    if (local_f0 == (long *)&local_e0) {
      uStack_58 = uStack_d8;
      local_70 = &local_60;
    }
    else {
      local_70 = local_f0;
    }
    local_60 = CONCAT71(uStack_df,local_e0);
    local_68 = local_e8;
    local_e8 = 0;
    local_e0 = 0;
    local_f0 = (long *)&local_e0;
    std::variant<std::monostate,long,double,StringLiteral,Identifier>::operator=
              ((variant<std::monostate,long,double,StringLiteral,Identifier> *)&(this->token).value,
               &local_50);
    std::__cxx11::string::operator=((string *)&(this->token).originalText,(string *)&local_70);
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    _Var2._M_p = local_90._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._name._M_dataplus._M_p != &local_50._name.field_2) {
      operator_delete(local_50._name._M_dataplus._M_p,
                      local_50._name.field_2._M_allocated_capacity + 1);
      _Var2._M_p = local_90._M_dataplus._M_p;
    }
  }
  else {
    paVar3 = &local_b0.field_2;
    if (local_110 == &local_100) {
      local_b0.field_2._8_8_ = local_100._8_8_;
      local_b0._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_b0._M_dataplus._M_p = (pointer)local_110;
    }
    local_b0._M_string_length = local_108;
    local_108 = 0;
    local_100._M_local_buf[0] = '\0';
    if (local_f0 == (long *)&local_e0) {
      uStack_b8 = uStack_d8;
      local_d0 = &local_c0;
    }
    else {
      local_d0 = local_f0;
    }
    local_c0 = CONCAT71(uStack_df,local_e0);
    local_c8 = local_e8;
    local_e8 = 0;
    local_e0 = 0;
    local_110 = &local_100;
    local_f0 = (long *)&local_e0;
    std::variant<std::monostate,long,double,StringLiteral,Identifier>::operator=
              ((variant<std::monostate,long,double,StringLiteral,Identifier> *)&(this->token).value,
               &local_b0);
    std::__cxx11::string::operator=((string *)&(this->token).originalText,(string *)&local_d0);
    _Var2._M_p = local_b0._M_dataplus._M_p;
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
      _Var2._M_p = local_b0._M_dataplus._M_p;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var2._M_p != paVar3) {
    operator_delete(_Var2._M_p,paVar3->_M_allocated_capacity + 1);
  }
  this->linePos = this->linePos + length;
  if (local_f0 != (long *)&local_e0) {
    operator_delete(local_f0,CONCAT71(uStack_df,local_e0) + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,
                    CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void FileTokenizer::createToken(TokenType type, size_t length, const std::string& value, size_t valuePos, size_t valueLength)
{
	token.type = type;
	token.line = lineNumber;
	token.column = linePos+1;

	std::string valueStr = value.substr(valuePos, valueLength);
	std::string originalStr = currentLine.substr(linePos, length);
	if (type == TokenType::Identifier || type == TokenType::Equ)
		token.setValue(Identifier(std::move(valueStr)), std::move(originalStr));
	else
		token.setValue(std::move(valueStr), std::move(originalStr));

	linePos += length;
}